

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

void __thiscall CTransaction::CTransaction(CTransaction *this,CMutableTransaction *tx)

{
  bool bVar1;
  bool *pbVar2;
  long in_RSI;
  CTransaction *in_RDI;
  long in_FS_OFFSET;
  vector<CTxIn,_std::allocator<CTxIn>_> *unaff_retaddr;
  CTransaction *this_00;
  vector<CTxIn,_std::allocator<CTxIn>_> *__x;
  
  __x = *(vector<CTxIn,_std::allocator<CTxIn>_> **)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::vector(unaff_retaddr,__x);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)unaff_retaddr,
             (vector<CTxOut,_std::allocator<CTxOut>_> *)__x);
  in_RDI->version = *(uint32_t *)(in_RSI + 0x30);
  in_RDI->nLockTime = *(uint32_t *)(in_RSI + 0x34);
  pbVar2 = &in_RDI->m_has_witness;
  bVar1 = ComputeHasWitness(this_00);
  *pbVar2 = bVar1;
  ComputeHash(this_00);
  ComputeWitnessHash(in_RDI);
  if (*(vector<CTxIn,_std::allocator<CTxIn>_> **)(in_FS_OFFSET + 0x28) == __x) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTransaction::CTransaction(const CMutableTransaction& tx) : vin(tx.vin), vout(tx.vout), version{tx.version}, nLockTime{tx.nLockTime}, m_has_witness{ComputeHasWitness()}, hash{ComputeHash()}, m_witness_hash{ComputeWitnessHash()} {}